

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

StringRef __thiscall
Catch::Capturer::Capturer::anon_class_8_1_a855c668::operator()
          (anon_class_8_1_a855c668 *this,size_t start,size_t end)

{
  StringRef *pSVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  StringRef SVar9;
  
  pSVar1 = this->names;
  pcVar2 = pSVar1->m_start;
  do {
    if ((byte)pcVar2[start] != 0x2c) {
      iVar4 = isspace((uint)(byte)pcVar2[start]);
      if (iVar4 == 0) {
        pbVar7 = (byte *)(pcVar2 + end);
        uVar8 = (end + 1) - start;
        do {
          if (*pbVar7 != 0x2c) {
            iVar4 = isspace((uint)*pbVar7);
            if (iVar4 == 0) {
              uVar3 = pSVar1->m_size;
              uVar6 = uVar3 - start;
              pcVar5 = "";
              if (start <= uVar3 && uVar6 != 0) {
                pcVar5 = pcVar2 + start;
              }
              if (uVar8 <= uVar6) {
                uVar6 = uVar8;
              }
              uVar8 = 0;
              if (start < uVar3) {
                uVar8 = uVar6;
              }
              SVar9.m_size = uVar8;
              SVar9.m_start = pcVar5;
              return SVar9;
            }
          }
          uVar8 = uVar8 - 1;
          pbVar7 = pbVar7 + -1;
        } while( true );
      }
    }
    start = start + 1;
  } while( true );
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(static_cast<unsigned char>(names[start]))) {
                ++start;
            }
            while (names[end] == ',' || isspace(static_cast<unsigned char>(names[end]))) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };
        auto skipq = [&] (size_t start, char quote) {
            for (auto i = start + 1; i < names.size() ; ++i) {
                if (names[i] == quote)
                    return i;
                if (names[i] == '\\')
                    ++i;
            }
            CATCH_INTERNAL_ERROR("CAPTURE parsing encountered unmatched quote");
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case '"':
            case '\'':
                pos = skipq(pos, c);
                break;
            case ',':
                if (start != pos && openings.empty()) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = static_cast<std::string>(trimmed(start, pos));
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.empty() && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = static_cast<std::string>(trimmed(start, names.size() - 1));
        m_messages.back().message += " := ";
    }